

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::InternalSwap
          (RandomBernoulliStaticLayerParams *this,RandomBernoulliStaticLayerParams *other)

{
  RandomBernoulliStaticLayerParams *other_local;
  RandomBernoulliStaticLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  std::swap<long>(&this->seed_,&other->seed_);
  std::swap<float>(&this->prob_,&other->prob_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void RandomBernoulliStaticLayerParams::InternalSwap(RandomBernoulliStaticLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(seed_, other->seed_);
  std::swap(prob_, other->prob_);
  std::swap(_cached_size_, other->_cached_size_);
}